

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall cmDependsFortran::MatchLocalModules(cmDependsFortran *this)

{
  cmDependsFortranInternals *pcVar1;
  _Base_ptr p_Var2;
  
  pcVar1 = (this->Internal)._M_t.
           super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
           .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
  for (p_Var2 = *(_Base_ptr *)((long)&(pcVar1->TargetProvides)._M_t + 0x18);
      p_Var2 != (_Rb_tree_node_base *)((long)&(pcVar1->TargetProvides)._M_t + 8U);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    ConsiderModule(this,(string *)(p_Var2 + 1),&(this->super_cmDepends).TargetDirectory);
  }
  return;
}

Assistant:

void cmDependsFortran::MatchLocalModules()
{
  std::string const& stampDir = this->TargetDirectory;
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    this->ConsiderModule(i, stampDir);
  }
}